

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3ParseUri(char *zDefaultVfs,char *zUri,uint *pFlags,sqlite3_vfs **ppVfs,char **pzFile,
                   char **pzErrMsg)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  undefined4 *puVar6;
  sqlite3_vfs *psVar7;
  char *pcVar8;
  char *pcVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  char *z;
  long lVar13;
  byte bVar14;
  byte bVar15;
  uint uVar16;
  byte *pbVar17;
  OpenMode *pOVar18;
  uint uVar19;
  char *__s;
  ulong n;
  uint local_8c;
  char *local_80;
  int *local_70;
  
  uVar12 = *pFlags;
  if (zUri == (char *)0x0) {
    uVar19 = 0;
  }
  else {
    sVar5 = strlen(zUri);
    uVar19 = (uint)sVar5 & 0x3fffffff;
  }
  if (((4 < uVar19 & (sqlite3Config.bOpenUri != '\0' | (byte)uVar12 >> 6)) == 1) &&
     (zUri[4] == ':' && *(int *)zUri == 0x656c6966)) {
    n = (ulong)(uVar19 + 8);
    uVar11 = 0;
    do {
      n = n + (zUri[uVar11] == '&');
      uVar11 = uVar11 + 1;
    } while (uVar19 != uVar11);
    iVar3 = sqlite3_initialize();
    if (iVar3 == 0) {
      puVar6 = (undefined4 *)sqlite3Malloc(n);
    }
    else {
      puVar6 = (undefined4 *)0x0;
    }
    uVar12 = uVar12 | 0x40;
    if (puVar6 == (undefined4 *)0x0) {
      iVar4 = 1;
      __s = (char *)0x0;
      iVar3 = 0;
    }
    else {
      *puVar6 = 0;
      __s = (char *)(puVar6 + 1);
      uVar11 = 5;
      if ((zUri[5] != '/') || (zUri[6] != '/')) {
LAB_00196433:
        iVar4 = 0;
        iVar3 = 0;
        do {
          lVar13 = (long)iVar3;
          uVar11 = uVar11 & 0xffffffff;
LAB_00196444:
          do {
            uVar19 = (uint)uVar11;
            bVar14 = zUri[(int)uVar19];
            if ((bVar14 == 0) || (bVar14 == 0x23)) {
              if (iVar4 == 1) {
                iVar3 = iVar3 + 1;
                __s[lVar13] = '\0';
              }
              pcVar8 = __s + iVar3;
              pcVar8[0] = '\0';
              pcVar8[1] = '\0';
              pcVar8[2] = '\0';
              pcVar8[3] = '\0';
              sVar5 = strlen(__s);
              local_70 = (int *)(__s + (ulong)((uint)sVar5 & 0x3fffffff) + 1);
              iVar3 = 0;
              goto LAB_001965fa;
            }
            uVar16 = uVar19 + 1;
            uVar11 = (ulong)uVar16;
            if (((bVar14 != 0x25) || (bVar15 = zUri[(int)uVar16], (""[bVar15] & 8) == 0)) ||
               (bVar1 = zUri[(long)(int)uVar19 + 2], (""[bVar1] & 8) == 0)) {
              if ((iVar4 == 1) && ((bVar14 == 0x3d || (bVar14 == 0x26)))) {
                if (*(char *)((long)puVar6 + lVar13 + 3) == '\0') {
                  pcVar8 = zUri + (int)uVar16;
                  do {
                    uVar19 = uVar19 + 1;
                    iVar4 = 1;
                    if ((*pcVar8 == '\0') || (*pcVar8 == '#')) {
                      uVar11 = (ulong)uVar19;
                      break;
                    }
                    pcVar9 = pcVar8 + -1;
                    uVar11 = (ulong)uVar19;
                    pcVar8 = pcVar8 + 1;
                  } while (*pcVar9 != '&');
                  goto LAB_00196444;
                }
                if (bVar14 == 0x26) {
                  iVar3 = iVar3 + 1;
                  __s[lVar13] = '\0';
                  goto LAB_001965af;
                }
                iVar4 = 2;
              }
              else {
                if (((iVar4 != 0) || (bVar14 != 0x3f)) && ((iVar4 != 2 || (bVar14 != 0x26)))) break;
LAB_001965af:
                iVar4 = 1;
              }
              bVar14 = 0;
              break;
            }
            uVar19 = uVar19 + 3;
            uVar11 = (ulong)uVar19;
            bVar15 = ((char)(bVar1 * '\x02') >> 7 & 9U) + bVar1 & 0xf |
                     (((char)(bVar15 * '\x02') >> 7 & 9U) + bVar15) * '\x10';
            bVar14 = bVar15;
            if (bVar15 == 0) {
              pbVar17 = (byte *)(zUri + (int)uVar19);
              do {
                uVar11 = (ulong)uVar19;
                bVar14 = *pbVar17;
                if ((((bVar14 == 0) || (bVar14 == 0x23)) || ((iVar4 == 0 && (bVar14 == 0x3f)))) ||
                   ((iVar4 == 1 && ((bVar14 == 0x26 || (bVar14 == 0x3d)))))) break;
                uVar19 = uVar19 + 1;
                pbVar17 = pbVar17 + 1;
              } while ((iVar4 != 2) || (bVar14 != 0x26));
            }
          } while (bVar15 == 0);
          lVar13 = (long)iVar3;
          iVar3 = iVar3 + 1;
          __s[lVar13] = bVar14;
        } while( true );
      }
      for (lVar13 = 0; (zUri[lVar13 + 7] != '\0' && (zUri[lVar13 + 7] != '/')); lVar13 = lVar13 + 1)
      {
      }
      uVar11 = lVar13 + 7;
      if ((int)uVar11 == 0x10) {
        if (zUri[0xf] == 't' && *(long *)(zUri + 7) == 0x736f686c61636f6c) {
          uVar11 = 0x10;
          goto LAB_00196433;
        }
      }
      else if ((int)uVar11 == 7) goto LAB_00196433;
      pcVar8 = sqlite3_mprintf("invalid uri authority: %.*s",lVar13,zUri + 7);
      *pzErrMsg = pcVar8;
      iVar3 = 1;
      iVar4 = 7;
    }
    goto LAB_00196841;
  }
  iVar3 = sqlite3_initialize();
  if (iVar3 == 0) {
    puVar6 = (undefined4 *)sqlite3Malloc((ulong)(uVar19 + 8));
  }
  else {
    puVar6 = (undefined4 *)0x0;
  }
  if (puVar6 == (undefined4 *)0x0) {
    return 7;
  }
  *puVar6 = 0;
  __s = (char *)(puVar6 + 1);
  if (uVar19 != 0) {
    memcpy(__s,zUri,(ulong)uVar19);
  }
  pcVar8 = __s + uVar19;
  pcVar8[0] = '\0';
  pcVar8[1] = '\0';
  pcVar8[2] = '\0';
  pcVar8[3] = '\0';
  uVar12 = uVar12 & 0xffffffbf;
  iVar3 = 0;
  goto LAB_00196313;
LAB_001965fa:
  do {
    if ((char)*local_70 == '\0') {
      iVar4 = 0;
      break;
    }
    sVar5 = strlen((char *)local_70);
    uVar19 = (uint)sVar5 & 0x3fffffff;
    pcVar8 = (char *)((long)local_70 + (ulong)uVar19 + 1);
    sVar5 = strlen(pcVar8);
    uVar16 = (uint)sVar5;
    if (uVar19 == 5) {
      if ((char)local_70[1] != 'e' || *local_70 != 0x68636163) goto LAB_0019669e;
      local_8c = 0x60000;
      pOVar18 = sqlite3ParseUri::aCacheMode;
      local_80 = "cache";
LAB_001966b2:
      uVar10 = local_8c;
      if ((uVar19 == 4) && (*local_70 == 0x65646f6d)) {
        local_8c = 0x87;
        pOVar18 = sqlite3ParseUri::aOpenMode;
        local_80 = "access";
        uVar10 = uVar12 & 0x87;
      }
      bVar2 = true;
      if (pOVar18 == (OpenMode *)0x0) {
        iVar4 = 0;
      }
      else {
        pcVar9 = pOVar18->z;
        if (pcVar9 == (char *)0x0) {
          uVar19 = 0;
        }
        else {
          uVar19 = 0;
          do {
            sVar5 = strlen(pcVar9);
            bVar2 = true;
            if (((((uint)sVar5 ^ uVar16) & 0x3fffffff) == 0) &&
               (iVar4 = bcmp(pcVar8,pcVar9,(ulong)(uVar16 & 0x3fffffff)), iVar4 == 0)) {
              uVar19 = pOVar18->mode;
              bVar2 = false;
            }
          } while ((bVar2) && (pcVar9 = pOVar18[1].z, pOVar18 = pOVar18 + 1, pcVar9 != (char *)0x0))
          ;
        }
        if (uVar19 == 0) {
          bVar2 = false;
          pcVar9 = sqlite3_mprintf("no such %s mode: %s",local_80,pcVar8);
          *pzErrMsg = pcVar9;
          iVar3 = 1;
          iVar4 = 7;
        }
        else if ((int)uVar10 < (int)(uVar19 & 0xffffff7f)) {
          bVar2 = false;
          pcVar9 = sqlite3_mprintf("%s mode not allowed: %s",local_80,pcVar8);
          *pzErrMsg = pcVar9;
          iVar3 = 3;
          iVar4 = 7;
        }
        else {
          uVar12 = uVar12 & ~local_8c | uVar19;
          iVar4 = 0;
          bVar2 = true;
        }
      }
      pcVar9 = zDefaultVfs;
      if (bVar2) goto LAB_0019680d;
    }
    else {
      if ((uVar19 != 3) ||
         (pcVar9 = pcVar8, *(char *)((long)local_70 + 2) != 's' || (short)*local_70 != 0x6676)) {
LAB_0019669e:
        pOVar18 = (OpenMode *)0x0;
        local_80 = (char *)0x0;
        local_8c = 0;
        goto LAB_001966b2;
      }
LAB_0019680d:
      local_70 = (int *)(pcVar8 + (ulong)(uVar16 & 0x3fffffff) + 1);
      iVar4 = 0;
      zDefaultVfs = pcVar9;
    }
  } while (iVar4 == 0);
LAB_00196841:
  if (iVar4 != 0) {
    if (iVar4 != 7) {
      return 7;
    }
    goto LAB_00196855;
  }
LAB_00196313:
  psVar7 = sqlite3_vfs_find(zDefaultVfs);
  *ppVfs = psVar7;
  if (psVar7 == (sqlite3_vfs *)0x0) {
    pcVar8 = sqlite3_mprintf("no such vfs: %s",zDefaultVfs);
    *pzErrMsg = pcVar8;
    iVar3 = 1;
  }
LAB_00196855:
  if (iVar3 != 0) {
    sqlite3_free_filename(__s);
    __s = (char *)0x0;
  }
  *pFlags = uVar12;
  *pzFile = __s;
  return iVar3;
}

Assistant:

SQLITE_PRIVATE int sqlite3ParseUri(
  const char *zDefaultVfs,        /* VFS to use if no "vfs=xxx" query option */
  const char *zUri,               /* Nul-terminated URI to parse */
  unsigned int *pFlags,           /* IN/OUT: SQLITE_OPEN_XXX flags */
  sqlite3_vfs **ppVfs,            /* OUT: VFS to use */
  char **pzFile,                  /* OUT: Filename component of URI */
  char **pzErrMsg                 /* OUT: Error message (if rc!=SQLITE_OK) */
){
  int rc = SQLITE_OK;
  unsigned int flags = *pFlags;
  const char *zVfs = zDefaultVfs;
  char *zFile;
  char c;
  int nUri = sqlite3Strlen30(zUri);

  assert( *pzErrMsg==0 );

  if( ((flags & SQLITE_OPEN_URI)             /* IMP: R-48725-32206 */
            || sqlite3GlobalConfig.bOpenUri) /* IMP: R-51689-46548 */
   && nUri>=5 && memcmp(zUri, "file:", 5)==0 /* IMP: R-57884-37496 */
  ){
    char *zOpt;
    int eState;                   /* Parser state when parsing URI */
    int iIn;                      /* Input character index */
    int iOut = 0;                 /* Output character index */
    u64 nByte = nUri+8;           /* Bytes of space to allocate */

    /* Make sure the SQLITE_OPEN_URI flag is set to indicate to the VFS xOpen
    ** method that there may be extra parameters following the file-name.  */
    flags |= SQLITE_OPEN_URI;

    for(iIn=0; iIn<nUri; iIn++) nByte += (zUri[iIn]=='&');
    zFile = sqlite3_malloc64(nByte);
    if( !zFile ) return SQLITE_NOMEM_BKPT;

    memset(zFile, 0, 4);  /* 4-byte of 0x00 is the start of DB name marker */
    zFile += 4;

    iIn = 5;
#ifdef SQLITE_ALLOW_URI_AUTHORITY
    if( strncmp(zUri+5, "///", 3)==0 ){
      iIn = 7;
      /* The following condition causes URIs with five leading / characters
      ** like file://///host/path to be converted into UNCs like //host/path.
      ** The correct URI for that UNC has only two or four leading / characters
      ** file://host/path or file:////host/path.  But 5 leading slashes is a
      ** common error, we are told, so we handle it as a special case. */
      if( strncmp(zUri+7, "///", 3)==0 ){ iIn++; }
    }else if( strncmp(zUri+5, "//localhost/", 12)==0 ){
      iIn = 16;
    }
#else
    /* Discard the scheme and authority segments of the URI. */
    if( zUri[5]=='/' && zUri[6]=='/' ){
      iIn = 7;
      while( zUri[iIn] && zUri[iIn]!='/' ) iIn++;
      if( iIn!=7 && (iIn!=16 || memcmp("localhost", &zUri[7], 9)) ){
        *pzErrMsg = sqlite3_mprintf("invalid uri authority: %.*s",
            iIn-7, &zUri[7]);
        rc = SQLITE_ERROR;
        goto parse_uri_out;
      }
    }
#endif

    /* Copy the filename and any query parameters into the zFile buffer.
    ** Decode %HH escape codes along the way.
    **
    ** Within this loop, variable eState may be set to 0, 1 or 2, depending
    ** on the parsing context. As follows:
    **
    **   0: Parsing file-name.
    **   1: Parsing name section of a name=value query parameter.
    **   2: Parsing value section of a name=value query parameter.
    */
    eState = 0;
    while( (c = zUri[iIn])!=0 && c!='#' ){
      iIn++;
      if( c=='%'
       && sqlite3Isxdigit(zUri[iIn])
       && sqlite3Isxdigit(zUri[iIn+1])
      ){
        int octet = (sqlite3HexToInt(zUri[iIn++]) << 4);
        octet += sqlite3HexToInt(zUri[iIn++]);

        assert( octet>=0 && octet<256 );
        if( octet==0 ){
#ifndef SQLITE_ENABLE_URI_00_ERROR
          /* This branch is taken when "%00" appears within the URI. In this
          ** case we ignore all text in the remainder of the path, name or
          ** value currently being parsed. So ignore the current character
          ** and skip to the next "?", "=" or "&", as appropriate. */
          while( (c = zUri[iIn])!=0 && c!='#'
              && (eState!=0 || c!='?')
              && (eState!=1 || (c!='=' && c!='&'))
              && (eState!=2 || c!='&')
          ){
            iIn++;
          }
          continue;
#else
          /* If ENABLE_URI_00_ERROR is defined, "%00" in a URI is an error. */
          *pzErrMsg = sqlite3_mprintf("unexpected %%00 in uri");
          rc = SQLITE_ERROR;
          goto parse_uri_out;
#endif
        }
        c = octet;
      }else if( eState==1 && (c=='&' || c=='=') ){
        if( zFile[iOut-1]==0 ){
          /* An empty option name. Ignore this option altogether. */
          while( zUri[iIn] && zUri[iIn]!='#' && zUri[iIn-1]!='&' ) iIn++;
          continue;
        }
        if( c=='&' ){
          zFile[iOut++] = '\0';
        }else{
          eState = 2;
        }
        c = 0;
      }else if( (eState==0 && c=='?') || (eState==2 && c=='&') ){
        c = 0;
        eState = 1;
      }
      zFile[iOut++] = c;
    }
    if( eState==1 ) zFile[iOut++] = '\0';
    memset(zFile+iOut, 0, 4); /* end-of-options + empty journal filenames */

    /* Check if there were any options specified that should be interpreted
    ** here. Options that are interpreted here include "vfs" and those that
    ** correspond to flags that may be passed to the sqlite3_open_v2()
    ** method. */
    zOpt = &zFile[sqlite3Strlen30(zFile)+1];
    while( zOpt[0] ){
      int nOpt = sqlite3Strlen30(zOpt);
      char *zVal = &zOpt[nOpt+1];
      int nVal = sqlite3Strlen30(zVal);

      if( nOpt==3 && memcmp("vfs", zOpt, 3)==0 ){
        zVfs = zVal;
      }else{
        struct OpenMode {
          const char *z;
          int mode;
        } *aMode = 0;
        char *zModeType = 0;
        int mask = 0;
        int limit = 0;

        if( nOpt==5 && memcmp("cache", zOpt, 5)==0 ){
          static struct OpenMode aCacheMode[] = {
            { "shared",  SQLITE_OPEN_SHAREDCACHE },
            { "private", SQLITE_OPEN_PRIVATECACHE },
            { 0, 0 }
          };

          mask = SQLITE_OPEN_SHAREDCACHE|SQLITE_OPEN_PRIVATECACHE;
          aMode = aCacheMode;
          limit = mask;
          zModeType = "cache";
        }
        if( nOpt==4 && memcmp("mode", zOpt, 4)==0 ){
          static struct OpenMode aOpenMode[] = {
            { "ro",  SQLITE_OPEN_READONLY },
            { "rw",  SQLITE_OPEN_READWRITE },
            { "rwc", SQLITE_OPEN_READWRITE | SQLITE_OPEN_CREATE },
            { "memory", SQLITE_OPEN_MEMORY },
            { 0, 0 }
          };

          mask = SQLITE_OPEN_READONLY | SQLITE_OPEN_READWRITE
                   | SQLITE_OPEN_CREATE | SQLITE_OPEN_MEMORY;
          aMode = aOpenMode;
          limit = mask & flags;
          zModeType = "access";
        }

        if( aMode ){
          int i;
          int mode = 0;
          for(i=0; aMode[i].z; i++){
            const char *z = aMode[i].z;
            if( nVal==sqlite3Strlen30(z) && 0==memcmp(zVal, z, nVal) ){
              mode = aMode[i].mode;
              break;
            }
          }
          if( mode==0 ){
            *pzErrMsg = sqlite3_mprintf("no such %s mode: %s", zModeType, zVal);
            rc = SQLITE_ERROR;
            goto parse_uri_out;
          }
          if( (mode & ~SQLITE_OPEN_MEMORY)>limit ){
            *pzErrMsg = sqlite3_mprintf("%s mode not allowed: %s",
                                        zModeType, zVal);
            rc = SQLITE_PERM;
            goto parse_uri_out;
          }
          flags = (flags & ~mask) | mode;
        }
      }

      zOpt = &zVal[nVal+1];
    }

  }else{
    zFile = sqlite3_malloc64(nUri+8);
    if( !zFile ) return SQLITE_NOMEM_BKPT;
    memset(zFile, 0, 4);
    zFile += 4;
    if( nUri ){
      memcpy(zFile, zUri, nUri);
    }
    memset(zFile+nUri, 0, 4);
    flags &= ~SQLITE_OPEN_URI;
  }

  *ppVfs = sqlite3_vfs_find(zVfs);
  if( *ppVfs==0 ){
    *pzErrMsg = sqlite3_mprintf("no such vfs: %s", zVfs);
    rc = SQLITE_ERROR;
  }
 parse_uri_out:
  if( rc!=SQLITE_OK ){
    sqlite3_free_filename(zFile);
    zFile = 0;
  }
  *pFlags = flags;
  *pzFile = zFile;
  return rc;
}